

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapLandB18(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int *piVar18;
  int iVar19;
  int *piVar20;
  int *piVar21;
  long local_90;
  
  iVar19 = w + 2;
  iVar7 = (*l->p->getMap)(l->p,out,x + -1,z + -1,iVar19,h + 2);
  if (iVar7 == 0) {
    if (0 < h) {
      uVar3 = l->startSeed;
      lVar17 = (long)w;
      piVar20 = out + lVar17 * 2 + 6;
      piVar14 = out + lVar17 + 3;
      local_90 = 0;
      piVar18 = out;
      piVar21 = out;
      do {
        if (0 < w) {
          lVar9 = local_90 * iVar19;
          lVar12 = (local_90 + 2) * (long)iVar19;
          lVar10 = (long)(z + (int)local_90);
          lVar13 = 0;
          iVar7 = out[lVar12];
          iVar11 = out[lVar12 + 1];
          iVar16 = out[lVar9];
          iVar15 = out[lVar9 + 1];
          do {
            iVar8 = piVar14[lVar13];
            iVar1 = piVar21[lVar13 + 2];
            iVar2 = piVar20[lVar13];
            if (iVar8 == 1) {
              if (((iVar16 == 1) && (iVar7 == 1)) && (iVar1 == 1)) {
                iVar8 = 1;
                if (iVar2 == 1) goto LAB_001073b0;
              }
              lVar9 = (long)(x + (int)lVar13);
              lVar12 = uVar3 + lVar9;
              lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar10;
              lVar9 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar9;
              lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + lVar10;
              auVar5._8_8_ = lVar9 >> 0x3f;
              auVar5._0_8_ = lVar9 >> 0x18;
              cVar6 = (char)((SUB161(auVar5 % SEXT816(5),7) >> 7 & 5U) +
                            SUB161(auVar5 % SEXT816(5),0)) / -4 + '\x01';
LAB_001073ad:
              iVar8 = (int)cVar6;
            }
            else if ((iVar8 == 0) &&
                    (((iVar16 != 0 || (iVar7 != 0)) || ((iVar1 != 0 || (iVar8 = 0, iVar2 != 0))))))
            {
              lVar9 = (long)(x + (int)lVar13);
              lVar12 = uVar3 + lVar9;
              lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar10;
              lVar9 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar9;
              lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + lVar10;
              auVar4._8_8_ = lVar9 >> 0x3f;
              auVar4._0_8_ = lVar9 >> 0x18;
              cVar6 = (char)((SUB161(auVar4 % SEXT816(3),7) >> 7 & 3U) +
                            SUB161(auVar4 % SEXT816(3),0)) / '\x02';
              goto LAB_001073ad;
            }
LAB_001073b0:
            piVar18[lVar13] = iVar8;
            lVar13 = lVar13 + 1;
            iVar7 = iVar11;
            iVar11 = iVar2;
            iVar16 = iVar15;
            iVar15 = iVar1;
          } while (lVar17 != lVar13);
        }
        local_90 = local_90 + 1;
        piVar18 = piVar18 + lVar17;
        piVar20 = piVar20 + lVar17 + 2;
        piVar21 = piVar21 + lVar17 + 2;
        piVar14 = piVar14 + lVar17 + 2;
      } while (local_90 != h);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int mapLandB18(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, (int)pW, (int)pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        int v00 = vz0[0], vt0 = vz0[1];
        int v02 = vz2[0], vt2 = vz2[1];
        int v20, v22;
        int v11, v;

        for (i = 0; i < w; i++)
        {
            v11 = vz1[i+1];
            v20 = vz0[i+2];
            v22 = vz2[i+2];
            v = v11;

            if (v11 == 0 && (v00 != 0 || v02 != 0 || v20 != 0 || v22 != 0))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = mcFirstInt(cs, 3) / 2;
            }
            else if (v11 == 1 && (v00 != 1 || v02 != 1 || v20 != 1 || v22 != 1))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = 1 - mcFirstInt(cs, 5) / 4;
            }

            out[i + j*w] = v;
            v00 = vt0; vt0 = v20;
            v02 = vt2; vt2 = v22;
        }
    }

    return 0;
}